

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

char * spvc_compiler_get_cleansed_entry_point_name
                 (spvc_compiler compiler,char *name,SpvExecutionModel model)

{
  Compiler *this;
  string *psVar1;
  char *pcVar2;
  string cleansed_name;
  allocator local_81;
  string local_80 [2];
  string local_40;
  
  this = (compiler->compiler)._M_t.
         super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>.
         _M_t.
         super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
         .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl;
  std::__cxx11::string::string((string *)&local_40,name,&local_81);
  psVar1 = spirv_cross::Compiler::get_cleansed_entry_point_name(this,&local_40,model);
  std::__cxx11::string::string((string *)local_80,(string *)psVar1);
  std::__cxx11::string::~string((string *)&local_40);
  pcVar2 = spvc_context_s::allocate_name(compiler->context,local_80);
  std::__cxx11::string::~string((string *)local_80);
  return pcVar2;
}

Assistant:

const char *spvc_compiler_get_cleansed_entry_point_name(spvc_compiler compiler, const char *name,
                                                        SpvExecutionModel model)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto cleansed_name =
		    compiler->compiler->get_cleansed_entry_point_name(name, static_cast<spv::ExecutionModel>(model));
		return compiler->context->allocate_name(cleansed_name);
	}